

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::fulfill
          (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this,
          FixVoid<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *value)

{
  bool bVar1;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value_00;
  ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> local_1f0;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *local_18;
  FixVoid<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *value_local;
  Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *)
                this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>(local_18);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::ExceptionOr
              (&local_1f0,value_00);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::operator=
              (&this->result,&local_1f0);
    ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
    ~ExceptionOr(&local_1f0);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }